

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O2

int diffie_hellman_sha1(LIBSSH2_SESSION *session,BIGNUM *g,BIGNUM *p,int group_order,
                       uchar packet_type_init,uchar packet_type_reply,uchar *midhash,
                       unsigned_long midhash_len,kmdhgGPshakex_state_t *exchange_state)

{
  undefined8 uVar1;
  EVP_MD_CTX *ctx;
  uint uVar2;
  int iVar3;
  BN_CTX *pBVar4;
  BIGNUM *pBVar5;
  size_t sVar6;
  uchar *puVar7;
  uchar *puVar8;
  LIBSSH2_CRYPT_METHOD *pLVar9;
  _LIBSSH2_MAC_METHOD *p_Var10;
  LIBSSH2_COMP_METHOD *pLVar11;
  char *pcVar12;
  ulong uVar13;
  long lVar14;
  uchar *puVar15;
  size_t sVar16;
  EVP_MD_CTX *ctx_00;
  undefined7 in_register_00000081;
  ulong uVar17;
  undefined4 uVar18;
  long lStackY_70;
  EVP_MD_CTX *hash;
  EVP_MD_CTX *exchange_hash_ctx;
  int free_iv;
  int free_secret;
  undefined4 local_3c;
  BIGNUM *local_38;
  
  iVar3 = 0;
  uVar18 = (undefined4)CONCAT71(in_register_00000081,packet_type_init);
  local_38 = (BIGNUM *)p;
  switch(exchange_state->state) {
  case libssh2_NB_state_idle:
    exchange_state->k_value = (uchar *)0x0;
    exchange_state->e_packet = (uchar *)0x0;
    exchange_state->s_packet = (uchar *)0x0;
    local_3c = uVar18;
    pBVar4 = BN_CTX_new();
    exchange_state->ctx = (BN_CTX *)pBVar4;
    pBVar5 = BN_new();
    exchange_state->x = (BIGNUM *)pBVar5;
    pBVar5 = BN_new();
    exchange_state->e = (BIGNUM *)pBVar5;
    pBVar5 = BN_new();
    exchange_state->f = (BIGNUM *)pBVar5;
    pBVar5 = BN_new();
    exchange_state->k = (BIGNUM *)pBVar5;
    *(undefined8 *)&exchange_state->req_state = 0;
    (exchange_state->req_state).start = 0;
    BN_rand((BIGNUM *)exchange_state->x,group_order * 8 + -1,0,-1);
    BN_mod_exp((BIGNUM *)exchange_state->e,(BIGNUM *)g,(BIGNUM *)exchange_state->x,local_38,
               (BN_CTX *)exchange_state->ctx);
    iVar3 = BN_num_bits((BIGNUM *)exchange_state->e);
    exchange_state->e_packet_len = (long)((iVar3 + 7) / 8 + 6);
    uVar2 = BN_num_bits((BIGNUM *)exchange_state->e);
    sVar16 = exchange_state->e_packet_len;
    if ((uVar2 & 7) != 0) {
      sVar16 = sVar16 - 1;
      exchange_state->e_packet_len = sVar16;
    }
    puVar7 = (uchar *)(*session->alloc)(sVar16,&session->abstract);
    exchange_state->e_packet = puVar7;
    if (puVar7 != (uchar *)0x0) {
      *puVar7 = (uchar)local_3c;
      _libssh2_htonu32(exchange_state->e_packet + 1,(int)exchange_state->e_packet_len - 5);
      uVar2 = BN_num_bits((BIGNUM *)exchange_state->e);
      if ((uVar2 & 7) == 0) {
        exchange_state->e_packet[5] = '\0';
        lStackY_70 = 6;
      }
      else {
        lStackY_70 = 5;
      }
      BN_bn2bin((BIGNUM *)exchange_state->e,exchange_state->e_packet + lStackY_70);
      exchange_state->state = libssh2_NB_state_created;
      uVar18 = local_3c;
      goto switchD_00120a76_caseD_2;
    }
    pcVar12 = "Out of memory error";
    goto LAB_001216db;
  default:
    goto switchD_00120a76_caseD_1;
  case libssh2_NB_state_created:
switchD_00120a76_caseD_2:
    iVar3 = _libssh2_transport_send
                      (session,exchange_state->e_packet,exchange_state->e_packet_len,(uchar *)0x0,0)
    ;
    if (iVar3 == -0x25) {
      return -0x25;
    }
    if (iVar3 == 0) {
      exchange_state->state = libssh2_NB_state_sent;
      break;
    }
    pcVar12 = "Unable to send KEX init message";
    goto LAB_001216e1;
  case libssh2_NB_state_sent:
    break;
  case libssh2_NB_state_sent1:
    goto switchD_00120a76_caseD_4;
  case libssh2_NB_state_sent2:
    goto switchD_00120a76_caseD_5;
  case libssh2_NB_state_sent3:
    goto switchD_00120a76_caseD_6;
  }
  if ((session->field_0x80 & 1) != 0) {
    iVar3 = _libssh2_packet_burn(session,&exchange_state->burn_state);
    if (iVar3 == -0x25) {
      return -0x25;
    }
    if (iVar3 < 1) goto switchD_00120a76_caseD_1;
    session->field_0x80 = session->field_0x80 & 0xfe;
  }
  exchange_state->state = libssh2_NB_state_sent1;
switchD_00120a76_caseD_4:
  local_3c = uVar18;
  iVar3 = _libssh2_packet_require
                    (session,packet_type_reply,&exchange_state->s_packet,
                     &exchange_state->s_packet_len,0,(uchar *)0x0,0,&exchange_state->req_state);
  if (iVar3 == -0x25) {
    return -0x25;
  }
  if (iVar3 == 0) {
    exchange_state->s = exchange_state->s_packet + 1;
    uVar2 = _libssh2_ntohu32(exchange_state->s_packet + 1);
    session->server_hostkey_len = uVar2;
    exchange_state->s = exchange_state->s + 4;
    if (session->server_hostkey != (uchar *)0x0) {
      (*session->free)(session->server_hostkey,&session->abstract);
      uVar2 = session->server_hostkey_len;
    }
    puVar7 = (uchar *)(*session->alloc)((ulong)uVar2,&session->abstract);
    session->server_hostkey = puVar7;
    if (puVar7 == (uchar *)0x0) {
      pcVar12 = "Unable to allocate memory for a copy of the host key";
LAB_001216db:
      iVar3 = -6;
    }
    else {
      memcpy(puVar7,exchange_state->s,(ulong)session->server_hostkey_len);
      exchange_state->s = exchange_state->s + session->server_hostkey_len;
      iVar3 = _libssh2_md5_init(&exchange_hash_ctx);
      if (iVar3 != 0) {
        EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,session->server_hostkey,
                         (ulong)session->server_hostkey_len);
        EVP_DigestFinal((EVP_MD_CTX *)exchange_hash_ctx,session->server_hostkey_md5,(uint *)0x0);
        EVP_MD_CTX_free(exchange_hash_ctx);
      }
      session->server_hostkey_md5_valid = (uint)(iVar3 != 0);
      iVar3 = _libssh2_sha1_init(&exchange_hash_ctx);
      if (iVar3 != 0) {
        EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,session->server_hostkey,
                         (ulong)session->server_hostkey_len);
        EVP_DigestFinal((EVP_MD_CTX *)exchange_hash_ctx,session->server_hostkey_sha1,(uint *)0x0);
        EVP_MD_CTX_free(exchange_hash_ctx);
      }
      session->server_hostkey_sha1_valid = (uint)(iVar3 != 0);
      iVar3 = (*session->hostkey->init)
                        (session,session->server_hostkey,(ulong)session->server_hostkey_len,
                         &session->server_hostkey_abstract);
      if (iVar3 == 0) {
        uVar2 = _libssh2_ntohu32(exchange_state->s);
        exchange_state->f_value_len = (ulong)uVar2;
        puVar7 = exchange_state->s + 4;
        exchange_state->f_value = puVar7;
        exchange_state->s = exchange_state->s + (ulong)uVar2 + 4;
        BN_bin2bn(puVar7,uVar2,(BIGNUM *)exchange_state->f);
        uVar2 = _libssh2_ntohu32(exchange_state->s);
        exchange_state->h_sig_len = (ulong)uVar2;
        puVar7 = exchange_state->s;
        exchange_state->s = puVar7 + 4;
        exchange_state->h_sig = puVar7 + 4;
        BN_mod_exp((BIGNUM *)exchange_state->k,(BIGNUM *)exchange_state->f,
                   (BIGNUM *)exchange_state->x,local_38,(BN_CTX *)exchange_state->ctx);
        iVar3 = BN_num_bits((BIGNUM *)exchange_state->k);
        exchange_state->k_value_len = (long)((iVar3 + 7) / 8 + 5);
        uVar2 = BN_num_bits((BIGNUM *)exchange_state->k);
        sVar16 = exchange_state->k_value_len;
        if ((uVar2 & 7) != 0) {
          sVar16 = sVar16 - 1;
          exchange_state->k_value_len = sVar16;
        }
        puVar7 = (uchar *)(*session->alloc)(sVar16,&session->abstract);
        exchange_state->k_value = puVar7;
        if (puVar7 == (uchar *)0x0) {
          pcVar12 = "Unable to allocate buffer for K";
          goto LAB_001216db;
        }
        _libssh2_htonu32(puVar7,(int)exchange_state->k_value_len - 4);
        uVar2 = BN_num_bits((BIGNUM *)exchange_state->k);
        if ((uVar2 & 7) == 0) {
          lVar14 = 5;
          exchange_state->k_value[4] = '\0';
        }
        else {
          lVar14 = 4;
        }
        BN_bn2bin((BIGNUM *)exchange_state->k,exchange_state->k_value + lVar14);
        exchange_state->exchange_hash = &exchange_hash_ctx;
        _libssh2_sha1_init(&exchange_hash_ctx);
        puVar8 = (session->local).banner;
        puVar7 = exchange_state->h_sig_comp;
        if (puVar8 == (uchar *)0x0) {
          _libssh2_htonu32(puVar7,0x15);
          EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,puVar7,4);
          pcVar12 = "SSH-2.0-libssh2_1.8.0";
          sVar6 = 0x15;
          ctx_00 = (EVP_MD_CTX *)exchange_hash_ctx;
        }
        else {
          sVar6 = strlen((char *)puVar8);
          _libssh2_htonu32(puVar7,(int)sVar6 - 2);
          EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,puVar7,4);
          ctx_00 = (EVP_MD_CTX *)exchange_hash_ctx;
          pcVar12 = (char *)(session->local).banner;
          sVar6 = strlen(pcVar12);
          sVar6 = sVar6 - 2;
        }
        EVP_DigestUpdate(ctx_00,pcVar12,sVar6);
        sVar6 = strlen((char *)(session->remote).banner);
        _libssh2_htonu32(puVar7,(uint32_t)sVar6);
        EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,puVar7,4);
        ctx = exchange_hash_ctx;
        puVar8 = (session->remote).banner;
        sVar6 = strlen((char *)puVar8);
        EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar8,sVar6);
        _libssh2_htonu32(puVar7,(uint32_t)(session->local).kexinit_len);
        EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,puVar7,4);
        EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,(session->local).kexinit,
                         (session->local).kexinit_len);
        _libssh2_htonu32(puVar7,(uint32_t)(session->remote).kexinit_len);
        EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,puVar7,4);
        EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,(session->remote).kexinit,
                         (session->remote).kexinit_len);
        _libssh2_htonu32(puVar7,session->server_hostkey_len);
        EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,puVar7,4);
        EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,session->server_hostkey,
                         (ulong)session->server_hostkey_len);
        if ((char)local_3c == ' ') {
          _libssh2_htonu32(puVar7,0x400);
          _libssh2_htonu32(exchange_state->h_sig_comp + 4,0x600);
          _libssh2_htonu32(exchange_state->h_sig_comp + 8,0x800);
          EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,puVar7,0xc);
        }
        if (midhash != (uchar *)0x0) {
          EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,midhash,midhash_len);
        }
        EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,exchange_state->e_packet + 1,
                         exchange_state->e_packet_len - 1);
        _libssh2_htonu32(puVar7,(uint32_t)exchange_state->f_value_len);
        EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,puVar7,4);
        EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,exchange_state->f_value,
                         exchange_state->f_value_len);
        EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,exchange_state->k_value,
                         exchange_state->k_value_len);
        EVP_DigestFinal((EVP_MD_CTX *)exchange_hash_ctx,puVar7,(uint *)0x0);
        EVP_MD_CTX_free(exchange_hash_ctx);
        iVar3 = (*session->hostkey->sig_verify)
                          (session,exchange_state->h_sig,exchange_state->h_sig_len,puVar7,0x14,
                           &session->server_hostkey_abstract);
        if (iVar3 == 0) {
          exchange_state->c = '\x15';
          exchange_state->state = libssh2_NB_state_sent2;
switchD_00120a76_caseD_5:
          iVar3 = _libssh2_transport_send(session,&exchange_state->c,1,(uchar *)0x0,0);
          if (iVar3 == -0x25) {
            return -0x25;
          }
          if (iVar3 == 0) {
            exchange_state->state = libssh2_NB_state_sent3;
switchD_00120a76_caseD_6:
            iVar3 = _libssh2_packet_require
                              (session,'\x15',&exchange_state->tmp,&exchange_state->tmp_len,0,
                               (uchar *)0x0,0,&exchange_state->req_state);
            if (iVar3 == -0x25) {
              return -0x25;
            }
            if (iVar3 == 0) {
              *(byte *)&session->state = (byte)session->state | 2;
              (*session->free)(exchange_state->tmp,&session->abstract);
              if (session->session_id == (uchar *)0x0) {
                puVar7 = (uchar *)(*session->alloc)(0x14,&session->abstract);
                session->session_id = puVar7;
                if (puVar7 == (uchar *)0x0) {
                  pcVar12 = "Unable to allocate buffer for SHA digest";
                  goto LAB_001216db;
                }
                *(undefined4 *)(puVar7 + 0x10) = *(undefined4 *)(exchange_state->h_sig_comp + 0x10);
                uVar1 = *(undefined8 *)(exchange_state->h_sig_comp + 8);
                *(undefined8 *)puVar7 = *(undefined8 *)exchange_state->h_sig_comp;
                *(undefined8 *)(puVar7 + 8) = uVar1;
                session->session_id_len = 0x14;
              }
              pLVar9 = (session->local).crypt;
              if (pLVar9->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
                (*pLVar9->dtor)(session,&(session->local).crypt_abstract);
                pLVar9 = (session->local).crypt;
              }
              if (pLVar9->init ==
                  (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
                   *)0x0) {
LAB_001214f4:
                pLVar9 = (session->remote).crypt;
                if (pLVar9->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
                  (*pLVar9->dtor)(session,&(session->remote).crypt_abstract);
                  pLVar9 = (session->remote).crypt;
                }
                if (pLVar9->init !=
                    (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
                     *)0x0) {
                  free_iv = 0;
                  free_secret = 0;
                  puVar7 = (uchar *)(*session->alloc)((long)pLVar9->iv_len + 0x14,&session->abstract
                                                     );
                  if (puVar7 == (uchar *)0x0) goto LAB_001217d1;
                  for (uVar17 = 0; pLVar9 = (session->remote).crypt,
                      uVar17 < (ulong)(long)pLVar9->iv_len; uVar17 = uVar17 + 0x14) {
                    _libssh2_sha1_init(&hash);
                    EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->k_value,
                                     exchange_state->k_value_len);
                    EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->h_sig_comp,0x14);
                    uVar13 = uVar17;
                    puVar8 = puVar7;
                    if (uVar17 == 0) {
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,"B",1);
                      uVar13 = (ulong)session->session_id_len;
                      puVar8 = session->session_id;
                    }
                    EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar8,uVar13);
                    EVP_DigestFinal((EVP_MD_CTX *)hash,puVar7 + uVar17,(uint *)0x0);
                    EVP_MD_CTX_free(hash);
                  }
                  puVar8 = (uchar *)(*session->alloc)((long)pLVar9->secret_len + 0x14,
                                                      &session->abstract);
                  if (puVar8 == (uchar *)0x0) goto LAB_001217cb;
                  for (uVar17 = 0; pLVar9 = (session->remote).crypt,
                      uVar17 < (ulong)(long)pLVar9->secret_len; uVar17 = uVar17 + 0x14) {
                    _libssh2_sha1_init(&hash);
                    EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->k_value,
                                     exchange_state->k_value_len);
                    EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->h_sig_comp,0x14);
                    uVar13 = uVar17;
                    puVar15 = puVar8;
                    if (uVar17 == 0) {
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,"D",1);
                      uVar13 = (ulong)session->session_id_len;
                      puVar15 = session->session_id;
                    }
                    EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar15,uVar13);
                    EVP_DigestFinal((EVP_MD_CTX *)hash,puVar8 + uVar17,(uint *)0x0);
                    EVP_MD_CTX_free(hash);
                  }
                  iVar3 = (*pLVar9->init)(session,pLVar9,puVar7,&free_iv,puVar8,&free_secret,0,
                                          &(session->remote).crypt_abstract);
                  puVar15 = puVar7;
                  if (iVar3 != 0) goto LAB_001217bf;
                  if (free_iv != 0) {
                    memset(puVar7,0,(long)((session->remote).crypt)->iv_len);
                    (*session->free)(puVar7,&session->abstract);
                  }
                  if (free_secret != 0) {
                    memset(puVar8,0,(long)((session->remote).crypt)->secret_len);
                    (*session->free)(puVar8,&session->abstract);
                  }
                }
                p_Var10 = (session->local).mac;
                if (p_Var10->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
                  (*p_Var10->dtor)(session,&(session->local).mac_abstract);
                  p_Var10 = (session->local).mac;
                }
                if (p_Var10->init !=
                    (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0) {
                  free_iv = 0;
                  puVar7 = (uchar *)(*session->alloc)((long)p_Var10->key_len + 0x14,
                                                      &session->abstract);
                  if (puVar7 == (uchar *)0x0) goto LAB_001217d1;
                  for (uVar17 = 0; p_Var10 = (session->local).mac,
                      uVar17 < (ulong)(long)p_Var10->key_len; uVar17 = uVar17 + 0x14) {
                    _libssh2_sha1_init(&hash);
                    EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->k_value,
                                     exchange_state->k_value_len);
                    EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->h_sig_comp,0x14);
                    uVar13 = uVar17;
                    puVar8 = puVar7;
                    if (uVar17 == 0) {
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,"E",1);
                      uVar13 = (ulong)session->session_id_len;
                      puVar8 = session->session_id;
                    }
                    EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar8,uVar13);
                    EVP_DigestFinal((EVP_MD_CTX *)hash,puVar7 + uVar17,(uint *)0x0);
                    EVP_MD_CTX_free(hash);
                  }
                  (*p_Var10->init)(session,puVar7,&free_iv,&(session->local).mac_abstract);
                  if (free_iv != 0) {
                    memset(puVar7,0,(long)((session->local).mac)->key_len);
                    (*session->free)(puVar7,&session->abstract);
                  }
                }
                p_Var10 = (session->remote).mac;
                if (p_Var10->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
                  (*p_Var10->dtor)(session,&(session->remote).mac_abstract);
                  p_Var10 = (session->remote).mac;
                }
                if (p_Var10->init !=
                    (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0) {
                  free_iv = 0;
                  puVar7 = (uchar *)(*session->alloc)((long)p_Var10->key_len + 0x14,
                                                      &session->abstract);
                  if (puVar7 == (uchar *)0x0) goto LAB_001217d1;
                  for (uVar17 = 0; p_Var10 = (session->remote).mac,
                      uVar17 < (ulong)(long)p_Var10->key_len; uVar17 = uVar17 + 0x14) {
                    _libssh2_sha1_init(&hash);
                    EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->k_value,
                                     exchange_state->k_value_len);
                    EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->h_sig_comp,0x14);
                    uVar13 = uVar17;
                    puVar8 = puVar7;
                    if (uVar17 == 0) {
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,"F",1);
                      uVar13 = (ulong)session->session_id_len;
                      puVar8 = session->session_id;
                    }
                    EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar8,uVar13);
                    EVP_DigestFinal((EVP_MD_CTX *)hash,puVar7 + uVar17,(uint *)0x0);
                    EVP_MD_CTX_free(hash);
                  }
                  (*p_Var10->init)(session,puVar7,&free_iv,&(session->remote).mac_abstract);
                  if (free_iv != 0) {
                    memset(puVar7,0,(long)((session->remote).mac)->key_len);
                    (*session->free)(puVar7,&session->abstract);
                  }
                }
                pLVar11 = (session->local).comp;
                if (pLVar11 != (LIBSSH2_COMP_METHOD *)0x0) {
                  if (pLVar11->dtor != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
                    (*pLVar11->dtor)(session,1,&(session->local).comp_abstract);
                    pLVar11 = (session->local).comp;
                    if (pLVar11 == (LIBSSH2_COMP_METHOD *)0x0) goto LAB_00121b02;
                  }
                  if ((pLVar11->init != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) &&
                     (iVar3 = (*pLVar11->init)(session,1,&(session->local).comp_abstract),
                     iVar3 != 0)) goto LAB_001217d1;
                }
LAB_00121b02:
                pLVar11 = (session->remote).comp;
                iVar3 = 0;
                if (pLVar11 != (LIBSSH2_COMP_METHOD *)0x0) {
                  if (pLVar11->dtor != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
                    iVar3 = 0;
                    (*pLVar11->dtor)(session,0,&(session->remote).comp_abstract);
                    pLVar11 = (session->remote).comp;
                    if (pLVar11 == (LIBSSH2_COMP_METHOD *)0x0) goto switchD_00120a76_caseD_1;
                  }
                  iVar3 = 0;
                  if (pLVar11->init != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
                    iVar3 = (*pLVar11->init)(session,0,&(session->remote).comp_abstract);
                    iVar3 = (uint)(iVar3 == 0) * 5 + -5;
                  }
                }
              }
              else {
                free_iv = 0;
                free_secret = 0;
                puVar7 = (uchar *)(*session->alloc)((long)pLVar9->iv_len + 0x14,&session->abstract);
                if (puVar7 == (uchar *)0x0) {
                  iVar3 = -1;
                  goto switchD_00120a76_caseD_1;
                }
                for (uVar17 = 0; pLVar9 = (session->local).crypt,
                    uVar17 < (ulong)(long)pLVar9->iv_len; uVar17 = uVar17 + 0x14) {
                  _libssh2_sha1_init(&hash);
                  EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->k_value,
                                   exchange_state->k_value_len);
                  EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->h_sig_comp,0x14);
                  uVar13 = uVar17;
                  puVar8 = puVar7;
                  if (uVar17 == 0) {
                    EVP_DigestUpdate((EVP_MD_CTX *)hash,"A",1);
                    uVar13 = (ulong)session->session_id_len;
                    puVar8 = session->session_id;
                  }
                  EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar8,uVar13);
                  EVP_DigestFinal((EVP_MD_CTX *)hash,puVar7 + uVar17,(uint *)0x0);
                  EVP_MD_CTX_free(hash);
                }
                puVar8 = (uchar *)(*session->alloc)((long)pLVar9->secret_len + 0x14,
                                                    &session->abstract);
                if (puVar8 != (uchar *)0x0) {
                  for (uVar17 = 0; pLVar9 = (session->local).crypt,
                      uVar17 < (ulong)(long)pLVar9->secret_len; uVar17 = uVar17 + 0x14) {
                    _libssh2_sha1_init(&hash);
                    EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->k_value,
                                     exchange_state->k_value_len);
                    EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->h_sig_comp,0x14);
                    uVar13 = uVar17;
                    puVar15 = puVar8;
                    if (uVar17 == 0) {
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,"C",1);
                      uVar13 = (ulong)session->session_id_len;
                      puVar15 = session->session_id;
                    }
                    EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar15,uVar13);
                    EVP_DigestFinal((EVP_MD_CTX *)hash,puVar8 + uVar17,(uint *)0x0);
                    EVP_MD_CTX_free(hash);
                  }
                  iVar3 = (*pLVar9->init)(session,pLVar9,puVar7,&free_iv,puVar8,&free_secret,1,
                                          &(session->local).crypt_abstract);
                  puVar15 = puVar7;
                  if (iVar3 == 0) {
                    if (free_iv != 0) {
                      memset(puVar7,0,(long)((session->local).crypt)->iv_len);
                      (*session->free)(puVar7,&session->abstract);
                    }
                    if (free_secret != 0) {
                      memset(puVar8,0,(long)((session->local).crypt)->secret_len);
                      (*session->free)(puVar8,&session->abstract);
                    }
                    goto LAB_001214f4;
                  }
LAB_001217bf:
                  puVar7 = puVar8;
                  (*session->free)(puVar15,&session->abstract);
                }
LAB_001217cb:
                (*session->free)(puVar7,&session->abstract);
LAB_001217d1:
                iVar3 = -5;
              }
              goto switchD_00120a76_caseD_1;
            }
            pcVar12 = "Timed out waiting for NEWKEYS";
          }
          else {
            pcVar12 = "Unable to send NEWKEYS message";
          }
        }
        else {
          pcVar12 = "Unable to verify hostkey signature";
          iVar3 = -0xb;
        }
      }
      else {
        pcVar12 = "Unable to initialize hostkey importer";
        iVar3 = -10;
      }
    }
  }
  else {
    pcVar12 = "Timed out waiting for KEX reply";
    iVar3 = -9;
  }
LAB_001216e1:
  iVar3 = _libssh2_error(session,iVar3,pcVar12);
switchD_00120a76_caseD_1:
  BN_clear_free((BIGNUM *)exchange_state->x);
  exchange_state->x = (BIGNUM *)0x0;
  BN_clear_free((BIGNUM *)exchange_state->e);
  exchange_state->e = (BIGNUM *)0x0;
  BN_clear_free((BIGNUM *)exchange_state->f);
  exchange_state->f = (BIGNUM *)0x0;
  BN_clear_free((BIGNUM *)exchange_state->k);
  exchange_state->k = (BIGNUM *)0x0;
  BN_CTX_free((BN_CTX *)exchange_state->ctx);
  exchange_state->ctx = (BN_CTX *)0x0;
  if (exchange_state->e_packet != (uchar *)0x0) {
    (*session->free)(exchange_state->e_packet,&session->abstract);
    exchange_state->e_packet = (uchar *)0x0;
  }
  if (exchange_state->s_packet != (uchar *)0x0) {
    (*session->free)(exchange_state->s_packet,&session->abstract);
    exchange_state->s_packet = (uchar *)0x0;
  }
  if (exchange_state->k_value != (uchar *)0x0) {
    (*session->free)(exchange_state->k_value,&session->abstract);
    exchange_state->k_value = (uchar *)0x0;
  }
  exchange_state->state = libssh2_NB_state_idle;
  return iVar3;
}

Assistant:

static int diffie_hellman_sha1(LIBSSH2_SESSION *session,
                               _libssh2_bn *g,
                               _libssh2_bn *p,
                               int group_order,
                               unsigned char packet_type_init,
                               unsigned char packet_type_reply,
                               unsigned char *midhash,
                               unsigned long midhash_len,
                               kmdhgGPshakex_state_t *exchange_state)
{
    int ret = 0;
    int rc;
    libssh2_sha1_ctx exchange_hash_ctx;

    if (exchange_state->state == libssh2_NB_state_idle) {
        /* Setup initial values */
        exchange_state->e_packet = NULL;
        exchange_state->s_packet = NULL;
        exchange_state->k_value = NULL;
        exchange_state->ctx = _libssh2_bn_ctx_new();
        exchange_state->x = _libssh2_bn_init(); /* Random from client */
        exchange_state->e = _libssh2_bn_init(); /* g^x mod p */
        exchange_state->f = _libssh2_bn_init_from_bin(); /* g^(Random from server) mod p */
        exchange_state->k = _libssh2_bn_init(); /* The shared secret: f^x mod p */

        /* Zero the whole thing out */
        memset(&exchange_state->req_state, 0, sizeof(packet_require_state_t));

        /* Generate x and e */
        _libssh2_bn_rand(exchange_state->x, group_order * 8 - 1, 0, -1);
        _libssh2_bn_mod_exp(exchange_state->e, g, exchange_state->x, p,
                            exchange_state->ctx);

        /* Send KEX init */
        /* packet_type(1) + String Length(4) + leading 0(1) */
        exchange_state->e_packet_len =
            _libssh2_bn_bytes(exchange_state->e) + 6;
        if (_libssh2_bn_bits(exchange_state->e) % 8) {
            /* Leading 00 not needed */
            exchange_state->e_packet_len--;
        }

        exchange_state->e_packet =
            LIBSSH2_ALLOC(session, exchange_state->e_packet_len);
        if (!exchange_state->e_packet) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                 "Out of memory error");
            goto clean_exit;
        }
        exchange_state->e_packet[0] = packet_type_init;
        _libssh2_htonu32(exchange_state->e_packet + 1,
                         exchange_state->e_packet_len - 5);
        if (_libssh2_bn_bits(exchange_state->e) % 8) {
            _libssh2_bn_to_bin(exchange_state->e,
                               exchange_state->e_packet + 5);
        } else {
            exchange_state->e_packet[5] = 0;
            _libssh2_bn_to_bin(exchange_state->e,
                               exchange_state->e_packet + 6);
        }

        _libssh2_debug(session, LIBSSH2_TRACE_KEX, "Sending KEX packet %d",
                       (int) packet_type_init);
        exchange_state->state = libssh2_NB_state_created;
    }

    if (exchange_state->state == libssh2_NB_state_created) {
        rc = _libssh2_transport_send(session, exchange_state->e_packet,
                                     exchange_state->e_packet_len,
                                     NULL, 0);
        if (rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        } else if (rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to send KEX init message");
            goto clean_exit;
        }
        exchange_state->state = libssh2_NB_state_sent;
    }

    if (exchange_state->state == libssh2_NB_state_sent) {
        if (session->burn_optimistic_kexinit) {
            /* The first KEX packet to come along will be the guess initially
             * sent by the server.  That guess turned out to be wrong so we
             * need to silently ignore it */
            int burn_type;

            _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                           "Waiting for badly guessed KEX packet (to be ignored)");
            burn_type =
                _libssh2_packet_burn(session, &exchange_state->burn_state);
            if (burn_type == LIBSSH2_ERROR_EAGAIN) {
                return burn_type;
            } else if (burn_type <= 0) {
                /* Failed to receive a packet */
                ret = burn_type;
                goto clean_exit;
            }
            session->burn_optimistic_kexinit = 0;

            _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                           "Burnt packet of type: %02x",
                           (unsigned int) burn_type);
        }

        exchange_state->state = libssh2_NB_state_sent1;
    }

    if (exchange_state->state == libssh2_NB_state_sent1) {
        /* Wait for KEX reply */
        rc = _libssh2_packet_require(session, packet_type_reply,
                                     &exchange_state->s_packet,
                                     &exchange_state->s_packet_len, 0, NULL,
                                     0, &exchange_state->req_state);
        if (rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        if (rc) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_TIMEOUT,
                                 "Timed out waiting for KEX reply");
            goto clean_exit;
        }

        /* Parse KEXDH_REPLY */
        exchange_state->s = exchange_state->s_packet + 1;

        session->server_hostkey_len = _libssh2_ntohu32(exchange_state->s);
        exchange_state->s += 4;

        if (session->server_hostkey)
            LIBSSH2_FREE(session, session->server_hostkey);

        session->server_hostkey =
            LIBSSH2_ALLOC(session, session->server_hostkey_len);
        if (!session->server_hostkey) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                 "Unable to allocate memory for a copy "
                                 "of the host key");
            goto clean_exit;
        }
        memcpy(session->server_hostkey, exchange_state->s,
               session->server_hostkey_len);
        exchange_state->s += session->server_hostkey_len;

#if LIBSSH2_MD5
        {
            libssh2_md5_ctx fingerprint_ctx;

            if (libssh2_md5_init(&fingerprint_ctx)) {
                libssh2_md5_update(fingerprint_ctx, session->server_hostkey,
                                   session->server_hostkey_len);
                libssh2_md5_final(fingerprint_ctx,
                                  session->server_hostkey_md5);
                session->server_hostkey_md5_valid = TRUE;
            }
            else {
                session->server_hostkey_md5_valid = FALSE;
            }
        }
#ifdef LIBSSH2DEBUG
        {
            char fingerprint[50], *fprint = fingerprint;
            int i;
            for(i = 0; i < 16; i++, fprint += 3) {
                snprintf(fprint, 4, "%02x:", session->server_hostkey_md5[i]);
            }
            *(--fprint) = '\0';
            _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                           "Server's MD5 Fingerprint: %s", fingerprint);
        }
#endif /* LIBSSH2DEBUG */
#endif /* ! LIBSSH2_MD5 */

        {
            libssh2_sha1_ctx fingerprint_ctx;

            if (libssh2_sha1_init(&fingerprint_ctx)) {
                libssh2_sha1_update(fingerprint_ctx, session->server_hostkey,
                                    session->server_hostkey_len);
                libssh2_sha1_final(fingerprint_ctx,
                                   session->server_hostkey_sha1);
                session->server_hostkey_sha1_valid = TRUE;
            }
            else {
                session->server_hostkey_sha1_valid = FALSE;
            }
        }
#ifdef LIBSSH2DEBUG
        {
            char fingerprint[64], *fprint = fingerprint;
            int i;

            for(i = 0; i < 20; i++, fprint += 3) {
                snprintf(fprint, 4, "%02x:", session->server_hostkey_sha1[i]);
            }
            *(--fprint) = '\0';
            _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                           "Server's SHA1 Fingerprint: %s", fingerprint);
        }
#endif /* LIBSSH2DEBUG */

        if (session->hostkey->init(session, session->server_hostkey,
                                   session->server_hostkey_len,
                                   &session->server_hostkey_abstract)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_INIT,
                                 "Unable to initialize hostkey importer");
            goto clean_exit;
        }

        exchange_state->f_value_len = _libssh2_ntohu32(exchange_state->s);
        exchange_state->s += 4;
        exchange_state->f_value = exchange_state->s;
        exchange_state->s += exchange_state->f_value_len;
        _libssh2_bn_from_bin(exchange_state->f, exchange_state->f_value_len,
                             exchange_state->f_value);

        exchange_state->h_sig_len = _libssh2_ntohu32(exchange_state->s);
        exchange_state->s += 4;
        exchange_state->h_sig = exchange_state->s;

        /* Compute the shared secret */
        _libssh2_bn_mod_exp(exchange_state->k, exchange_state->f,
                            exchange_state->x, p, exchange_state->ctx);
        exchange_state->k_value_len = _libssh2_bn_bytes(exchange_state->k) + 5;
        if (_libssh2_bn_bits(exchange_state->k) % 8) {
            /* don't need leading 00 */
            exchange_state->k_value_len--;
        }
        exchange_state->k_value =
            LIBSSH2_ALLOC(session, exchange_state->k_value_len);
        if (!exchange_state->k_value) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                 "Unable to allocate buffer for K");
            goto clean_exit;
        }
        _libssh2_htonu32(exchange_state->k_value,
                         exchange_state->k_value_len - 4);
        if (_libssh2_bn_bits(exchange_state->k) % 8) {
            _libssh2_bn_to_bin(exchange_state->k, exchange_state->k_value + 4);
        } else {
            exchange_state->k_value[4] = 0;
            _libssh2_bn_to_bin(exchange_state->k, exchange_state->k_value + 5);
        }

        exchange_state->exchange_hash = (void*)&exchange_hash_ctx;
        libssh2_sha1_init(&exchange_hash_ctx);

        if (session->local.banner) {
            _libssh2_htonu32(exchange_state->h_sig_comp,
                             strlen((char *) session->local.banner) - 2);
            libssh2_sha1_update(exchange_hash_ctx,
                                exchange_state->h_sig_comp, 4);
            libssh2_sha1_update(exchange_hash_ctx,
                                (char *) session->local.banner,
                                strlen((char *) session->local.banner) - 2);
        } else {
            _libssh2_htonu32(exchange_state->h_sig_comp,
                             sizeof(LIBSSH2_SSH_DEFAULT_BANNER) - 1);
            libssh2_sha1_update(exchange_hash_ctx,
                                exchange_state->h_sig_comp, 4);
            libssh2_sha1_update(exchange_hash_ctx,
                                LIBSSH2_SSH_DEFAULT_BANNER,
                                sizeof(LIBSSH2_SSH_DEFAULT_BANNER) - 1);
        }

        _libssh2_htonu32(exchange_state->h_sig_comp,
                         strlen((char *) session->remote.banner));
        libssh2_sha1_update(exchange_hash_ctx,
                            exchange_state->h_sig_comp, 4);
        libssh2_sha1_update(exchange_hash_ctx,
                            session->remote.banner,
                            strlen((char *) session->remote.banner));

        _libssh2_htonu32(exchange_state->h_sig_comp,
                         session->local.kexinit_len);
        libssh2_sha1_update(exchange_hash_ctx,
                            exchange_state->h_sig_comp, 4);
        libssh2_sha1_update(exchange_hash_ctx,
                            session->local.kexinit,
                            session->local.kexinit_len);

        _libssh2_htonu32(exchange_state->h_sig_comp,
                         session->remote.kexinit_len);
        libssh2_sha1_update(exchange_hash_ctx,
                            exchange_state->h_sig_comp, 4);
        libssh2_sha1_update(exchange_hash_ctx,
                            session->remote.kexinit,
                            session->remote.kexinit_len);

        _libssh2_htonu32(exchange_state->h_sig_comp,
                         session->server_hostkey_len);
        libssh2_sha1_update(exchange_hash_ctx,
                            exchange_state->h_sig_comp, 4);
        libssh2_sha1_update(exchange_hash_ctx,
                            session->server_hostkey,
                            session->server_hostkey_len);

        if (packet_type_init == SSH_MSG_KEX_DH_GEX_INIT) {
            /* diffie-hellman-group-exchange hashes additional fields */
#ifdef LIBSSH2_DH_GEX_NEW
            _libssh2_htonu32(exchange_state->h_sig_comp,
                             LIBSSH2_DH_GEX_MINGROUP);
            _libssh2_htonu32(exchange_state->h_sig_comp + 4,
                             LIBSSH2_DH_GEX_OPTGROUP);
            _libssh2_htonu32(exchange_state->h_sig_comp + 8,
                             LIBSSH2_DH_GEX_MAXGROUP);
            libssh2_sha1_update(exchange_hash_ctx,
                                exchange_state->h_sig_comp, 12);
#else
            _libssh2_htonu32(exchange_state->h_sig_comp,
                             LIBSSH2_DH_GEX_OPTGROUP);
            libssh2_sha1_update(exchange_hash_ctx,
                                exchange_state->h_sig_comp, 4);
#endif
        }

        if (midhash) {
            libssh2_sha1_update(exchange_hash_ctx, midhash,
                                midhash_len);
        }

        libssh2_sha1_update(exchange_hash_ctx,
                            exchange_state->e_packet + 1,
                            exchange_state->e_packet_len - 1);

        _libssh2_htonu32(exchange_state->h_sig_comp,
                         exchange_state->f_value_len);
        libssh2_sha1_update(exchange_hash_ctx,
                            exchange_state->h_sig_comp, 4);
        libssh2_sha1_update(exchange_hash_ctx,
                            exchange_state->f_value,
                            exchange_state->f_value_len);

        libssh2_sha1_update(exchange_hash_ctx,
                            exchange_state->k_value,
                            exchange_state->k_value_len);

        libssh2_sha1_final(exchange_hash_ctx,
                           exchange_state->h_sig_comp);

        if (session->hostkey->
            sig_verify(session, exchange_state->h_sig,
                       exchange_state->h_sig_len, exchange_state->h_sig_comp,
                       20, &session->server_hostkey_abstract)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_SIGN,
                                 "Unable to verify hostkey signature");
            goto clean_exit;
        }

        _libssh2_debug(session, LIBSSH2_TRACE_KEX, "Sending NEWKEYS message");
        exchange_state->c = SSH_MSG_NEWKEYS;

        exchange_state->state = libssh2_NB_state_sent2;
    }

    if (exchange_state->state == libssh2_NB_state_sent2) {
        rc = _libssh2_transport_send(session, &exchange_state->c, 1, NULL, 0);
        if (rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        } else if (rc) {
            ret = _libssh2_error(session, rc, "Unable to send NEWKEYS message");
            goto clean_exit;
        }

        exchange_state->state = libssh2_NB_state_sent3;
    }

    if (exchange_state->state == libssh2_NB_state_sent3) {
        rc = _libssh2_packet_require(session, SSH_MSG_NEWKEYS,
                                     &exchange_state->tmp,
                                     &exchange_state->tmp_len, 0, NULL, 0,
                                     &exchange_state->req_state);
        if (rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        } else if (rc) {
            ret = _libssh2_error(session, rc, "Timed out waiting for NEWKEYS");
            goto clean_exit;
        }
        /* The first key exchange has been performed,
           switch to active crypt/comp/mac mode */
        session->state |= LIBSSH2_STATE_NEWKEYS;
        _libssh2_debug(session, LIBSSH2_TRACE_KEX, "Received NEWKEYS message");

        /* This will actually end up being just packet_type(1)
           for this packet type anyway */
        LIBSSH2_FREE(session, exchange_state->tmp);

        if (!session->session_id) {
            session->session_id = LIBSSH2_ALLOC(session, SHA_DIGEST_LENGTH);
            if (!session->session_id) {
                ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                     "Unable to allocate buffer for SHA digest");
                goto clean_exit;
            }
            memcpy(session->session_id, exchange_state->h_sig_comp,
                   SHA_DIGEST_LENGTH);
            session->session_id_len = SHA_DIGEST_LENGTH;
            _libssh2_debug(session, LIBSSH2_TRACE_KEX, "session_id calculated");
        }

        /* Cleanup any existing cipher */
        if (session->local.crypt->dtor) {
            session->local.crypt->dtor(session,
                                       &session->local.crypt_abstract);
        }

        /* Calculate IV/Secret/Key for each direction */
        if (session->local.crypt->init) {
            unsigned char *iv = NULL, *secret = NULL;
            int free_iv = 0, free_secret = 0;

            LIBSSH2_KEX_METHOD_DIFFIE_HELLMAN_SHA1_HASH(iv,
                                                        session->local.crypt->
                                                        iv_len, "A");
            if (!iv) {
                ret = -1;
                goto clean_exit;
            }
            LIBSSH2_KEX_METHOD_DIFFIE_HELLMAN_SHA1_HASH(secret,
                                                        session->local.crypt->
                                                        secret_len, "C");
            if (!secret) {
                LIBSSH2_FREE(session, iv);
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            if (session->local.crypt->
                init(session, session->local.crypt, iv, &free_iv, secret,
                     &free_secret, 1, &session->local.crypt_abstract)) {
                LIBSSH2_FREE(session, iv);
                LIBSSH2_FREE(session, secret);
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }

            if (free_iv) {
                memset(iv, 0, session->local.crypt->iv_len);
                LIBSSH2_FREE(session, iv);
            }

            if (free_secret) {
                memset(secret, 0, session->local.crypt->secret_len);
                LIBSSH2_FREE(session, secret);
            }
        }
        _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                       "Client to Server IV and Key calculated");

        if (session->remote.crypt->dtor) {
            /* Cleanup any existing cipher */
            session->remote.crypt->dtor(session,
                                        &session->remote.crypt_abstract);
        }

        if (session->remote.crypt->init) {
            unsigned char *iv = NULL, *secret = NULL;
            int free_iv = 0, free_secret = 0;

            LIBSSH2_KEX_METHOD_DIFFIE_HELLMAN_SHA1_HASH(iv,
                                                        session->remote.crypt->
                                                        iv_len, "B");
            if (!iv) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            LIBSSH2_KEX_METHOD_DIFFIE_HELLMAN_SHA1_HASH(secret,
                                                        session->remote.crypt->
                                                        secret_len, "D");
            if (!secret) {
                LIBSSH2_FREE(session, iv);
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            if (session->remote.crypt->
                init(session, session->remote.crypt, iv, &free_iv, secret,
                     &free_secret, 0, &session->remote.crypt_abstract)) {
                LIBSSH2_FREE(session, iv);
                LIBSSH2_FREE(session, secret);
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }

            if (free_iv) {
                memset(iv, 0, session->remote.crypt->iv_len);
                LIBSSH2_FREE(session, iv);
            }

            if (free_secret) {
                memset(secret, 0, session->remote.crypt->secret_len);
                LIBSSH2_FREE(session, secret);
            }
        }
        _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                       "Server to Client IV and Key calculated");

        if (session->local.mac->dtor) {
            session->local.mac->dtor(session, &session->local.mac_abstract);
        }

        if (session->local.mac->init) {
            unsigned char *key = NULL;
            int free_key = 0;

            LIBSSH2_KEX_METHOD_DIFFIE_HELLMAN_SHA1_HASH(key,
                                                        session->local.mac->
                                                        key_len, "E");
            if (!key) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            session->local.mac->init(session, key, &free_key,
                                     &session->local.mac_abstract);

            if (free_key) {
                memset(key, 0, session->local.mac->key_len);
                LIBSSH2_FREE(session, key);
            }
        }
        _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                       "Client to Server HMAC Key calculated");

        if (session->remote.mac->dtor) {
            session->remote.mac->dtor(session, &session->remote.mac_abstract);
        }

        if (session->remote.mac->init) {
            unsigned char *key = NULL;
            int free_key = 0;

            LIBSSH2_KEX_METHOD_DIFFIE_HELLMAN_SHA1_HASH(key,
                                                        session->remote.mac->
                                                        key_len, "F");
            if (!key) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            session->remote.mac->init(session, key, &free_key,
                                      &session->remote.mac_abstract);

            if (free_key) {
                memset(key, 0, session->remote.mac->key_len);
                LIBSSH2_FREE(session, key);
            }
        }
        _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                       "Server to Client HMAC Key calculated");

        /* Initialize compression for each direction */

        /* Cleanup any existing compression */
        if (session->local.comp && session->local.comp->dtor) {
            session->local.comp->dtor(session, 1,
                                      &session->local.comp_abstract);
        }

        if (session->local.comp && session->local.comp->init) {
            if (session->local.comp->init(session, 1,
                                          &session->local.comp_abstract)) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
        }
        _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                       "Client to Server compression initialized");

        if (session->remote.comp && session->remote.comp->dtor) {
            session->remote.comp->dtor(session, 0,
                                       &session->remote.comp_abstract);
        }

        if (session->remote.comp && session->remote.comp->init) {
            if (session->remote.comp->init(session, 0,
                                           &session->remote.comp_abstract)) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
        }
        _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                       "Server to Client compression initialized");

    }

  clean_exit:
    _libssh2_bn_free(exchange_state->x);
    exchange_state->x = NULL;
    _libssh2_bn_free(exchange_state->e);
    exchange_state->e = NULL;
    _libssh2_bn_free(exchange_state->f);
    exchange_state->f = NULL;
    _libssh2_bn_free(exchange_state->k);
    exchange_state->k = NULL;
    _libssh2_bn_ctx_free(exchange_state->ctx);
    exchange_state->ctx = NULL;

    if (exchange_state->e_packet) {
        LIBSSH2_FREE(session, exchange_state->e_packet);
        exchange_state->e_packet = NULL;
    }

    if (exchange_state->s_packet) {
        LIBSSH2_FREE(session, exchange_state->s_packet);
        exchange_state->s_packet = NULL;
    }

    if (exchange_state->k_value) {
        LIBSSH2_FREE(session, exchange_state->k_value);
        exchange_state->k_value = NULL;
    }

    exchange_state->state = libssh2_NB_state_idle;

    return ret;
}